

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink_test.cc
# Opt level: O3

void __thiscall
google::protobuf::io::zc_sink_internal::anon_unknown_0::ZeroCopyStreamByteSinkTest_WriteLong_Test::
TestBody(ZeroCopyStreamByteSinkTest_WriteLong_Test *this)

{
  ChunkedString *this_00;
  char cVar1;
  ulong uVar2;
  char *message;
  string_view sVar3;
  ScopedTrace gtest_trace_188;
  ScopedTrace gtest_trace_184;
  ScopedTrace gtest_trace_180;
  ChunkedString input;
  ZeroCopyStreamByteSink byte_sink;
  ScopedTrace local_11b;
  ScopedTrace local_11a;
  ScopedTrace local_119;
  string local_118;
  ZeroCopyStreamByteSinkTest_WriteLong_Test *local_f8;
  basic_string_view<char,_std::char_traits<char>_> *local_f0;
  array<char,_10UL> *local_e8;
  ChunkedString local_e0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a8;
  uint64_t uStack_98;
  size_t local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  void *local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  ZeroCopyStreamByteSink local_58;
  
  this_00 = &(this->super_ZeroCopyStreamByteSinkTest).output_chunks_;
  local_e8 = &(this->super_ZeroCopyStreamByteSinkTest).output_;
  local_f0 = &(this->super_ZeroCopyStreamByteSinkTest).output_view_;
  local_f8 = this;
  while( true ) {
    zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
              ((string *)local_b8,this_00);
    testing::ScopedTrace::ScopedTrace
              (&local_119,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
               ,0xb4,(string *)local_b8);
    if (local_b8 != (undefined1  [8])&aStack_a8) {
      operator_delete((void *)local_b8,(ulong)(aStack_a8._M_allocated_capacity + 1));
    }
    local_e0.data_._M_len = 0xb;
    local_e0.data_._M_str = "0123456789A";
    local_e0.skipped_patterns_ = 1;
    local_e0.pattern_ = 0;
    do {
      local_e0.pattern_bit_idx_ = 0;
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                ((string *)local_b8,&local_e0);
      testing::ScopedTrace::ScopedTrace
                (&local_11a,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xb8,(string *)local_b8);
      if (local_b8 != (undefined1  [8])&aStack_a8) {
        operator_delete((void *)local_b8,(ulong)(aStack_a8._M_allocated_capacity + 1));
      }
      local_e8->_M_elems[8] = '\0';
      local_e8->_M_elems[9] = '\0';
      local_e8->_M_elems[0] = '\0';
      local_e8->_M_elems[1] = '\0';
      local_e8->_M_elems[2] = '\0';
      local_e8->_M_elems[3] = '\0';
      local_e8->_M_elems[4] = '\0';
      local_e8->_M_elems[5] = '\0';
      local_e8->_M_elems[6] = '\0';
      local_e8->_M_elems[7] = '\0';
      local_90 = (this->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_bit_idx_;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this_00->data_)._M_len;
      aStack_a8._M_allocated_capacity =
           (size_type)(this->super_ZeroCopyStreamByteSinkTest).output_chunks_.data_._M_str;
      aStack_a8._8_8_ = (this->super_ZeroCopyStreamByteSinkTest).output_chunks_.skipped_patterns_;
      uStack_98 = (this->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_;
      local_b8 = (undefined1  [8])&PTR__PatternedOutputStream_018eb780;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = (void *)0x0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_58.bytes_written_._0_1_ = 0;
      local_58._25_8_ = 0;
      local_58.buffer_ = (void *)0x0;
      local_58.buffer_size_._0_1_ = 0;
      local_58.buffer_size_._1_7_ = 0;
      local_58.stream_ = (ZeroCopyOutputStream *)local_b8;
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                (&local_118,&local_e0);
      testing::ScopedTrace::ScopedTrace
                (&local_11b,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xbc,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      while( true ) {
        sVar3 = ChunkedString::NextChunk(&local_e0);
        if (sVar3._M_len == 0) break;
        ZeroCopyStreamByteSink::Append(&local_58,sVar3._M_str,sVar3._M_len);
      }
      testing::ScopedTrace::~ScopedTrace(&local_11b);
      if (CONCAT71(local_58.buffer_size_._1_7_,(undefined1)local_58.buffer_size_) != 0) {
        (**(code **)(((_Alloc_hider *)&(local_58.stream_)->_vptr_ZeroCopyOutputStream)->_M_p + 0x18)
        )();
      }
      local_b8 = (undefined1  [8])&PTR__PatternedOutputStream_018eb780;
      if (local_78 != (void *)0x0) {
        operator_delete(local_78,local_68 - (long)local_78);
      }
      testing::ScopedTrace::~ScopedTrace(&local_11a);
      local_e0.pattern_ = local_e0.pattern_ + local_e0.skipped_patterns_;
    } while (local_e0.pattern_ < (ulong)(long)(1 << ((byte)local_e0.data_._M_len & 0x1f)));
    testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[11]>
              ((internal *)local_b8,"output_view_","\"0123456789\"",local_f0,
               (char (*) [11])0x1084ce8);
    cVar1 = local_b8[0];
    if (local_b8[0] == '\0') {
      testing::Message::Message((Message *)&local_58);
      message = anon_var_dwarf_a22956 + 5;
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xc3,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
      if ((string *)local_58.stream_ != (string *)0x0) {
        (**(code **)(((_Alloc_hider *)&(local_58.stream_)->_vptr_ZeroCopyOutputStream)->_M_p + 8))()
        ;
      }
    }
    if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0,local_b0);
    }
    testing::ScopedTrace::~ScopedTrace(&local_119);
    if ((cVar1 == '\0') ||
       (uVar2 = (local_f8->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_ +
                (local_f8->super_ZeroCopyStreamByteSinkTest).output_chunks_.skipped_patterns_,
       (local_f8->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_ = uVar2,
       (ulong)(long)(1 << ((byte)(local_f8->super_ZeroCopyStreamByteSinkTest).output_chunks_.data_.
                                 _M_len & 0x1f)) <= uVar2)) break;
    (local_f8->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_bit_idx_ = 0;
  }
  return;
}

Assistant:

TEST_F(ZeroCopyStreamByteSinkTest, WriteLong) {
  do {
    SCOPED_TRACE(output_chunks_.PatternAsQuotedString());
    ChunkedString input("0123456789A", 1);

    do {
      SCOPED_TRACE(input.PatternAsQuotedString());
      output_ = {};
      PatternedOutputStream output_stream(output_chunks_);
      ZeroCopyStreamByteSink byte_sink(&output_stream);
      SCOPED_TRACE(input.PatternAsQuotedString());
      absl::string_view chunk;
      while (!(chunk = input.NextChunk()).empty()) {
        byte_sink.Append(chunk.data(), chunk.size());
      }
    } while (input.NextPattern());

    ASSERT_EQ(output_view_, "0123456789");
  } while (output_chunks_.NextPattern());
}